

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O0

bool __thiscall
sf::priv::ImageLoader::saveImageToFile
          (ImageLoader *this,string *filename,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  bool bVar1;
  void *data;
  int extraout_var;
  ostream *poVar2;
  Vector2<unsigned_int> *in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  string *in_RSI;
  Vector2i convertedSize;
  string extension;
  size_t dot;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff04;
  undefined1 in_stack_ffffffffffffff06;
  undefined1 in_stack_ffffffffffffff07;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 uVar3;
  void *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  allocator *in_stack_ffffffffffffff58;
  int comp;
  string *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar4;
  Vector2<int> local_90;
  byte local_86;
  allocator local_85 [20];
  byte local_71;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  Vector2<unsigned_int> *local_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  string *local_18;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_ffffffffffffff07,
                              CONCAT16(in_stack_ffffffffffffff06,
                                       CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                                      )));
  if (((!bVar1) && (local_28->x != 0)) && (local_28->y != 0)) {
    local_30 = std::__cxx11::string::find_last_of((char)local_18,0x2e);
    local_71 = 0;
    local_86 = 0;
    if (local_30 == -1) {
      in_stack_ffffffffffffff58 = local_85;
      std::allocator<char>::allocator();
      local_86 = 1;
      std::__cxx11::string::string(local_50,"",in_stack_ffffffffffffff58);
    }
    else {
      in_stack_ffffffffffffff60 = local_70;
      std::__cxx11::string::substr((ulong)in_stack_ffffffffffffff60,(ulong)local_18);
      local_71 = 1;
      anon_unknown.dwarf_eeee9::toLower
                ((string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
    if ((local_86 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_85);
    }
    if ((local_71 & 1) != 0) {
      std::__cxx11::string::~string(local_70);
    }
    Vector2<int>::Vector2<unsigned_int>(&local_90,local_28);
    bVar1 = std::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    iVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff54);
    if (bVar1) {
      data = (void *)std::__cxx11::string::c_str();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_20,0);
      iVar4 = stbi_write_bmp((char *)in_stack_ffffffffffffff58,iVar4,in_stack_ffffffffffffff50,
                             local_90.y,data);
      if (iVar4 == 0) goto LAB_001d6bca;
      local_1 = 1;
      iVar4 = 1;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (bVar1) {
        std::__cxx11::string::c_str();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_20,0);
        iVar4 = stbi_write_tga((char *)in_stack_ffffffffffffff58,iVar4,in_stack_ffffffffffffff50,
                               in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
        if (iVar4 != 0) {
          local_1 = 1;
          iVar4 = 1;
          goto LAB_001d6bd5;
        }
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        comp = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
        if (bVar1) {
          std::__cxx11::string::c_str();
          uVar3 = 0;
          iVar4 = extraout_var;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_20,0);
          iVar4 = stbi_write_png((char *)CONCAT44(uVar3,local_90.y),local_90.x,
                                 in_stack_ffffffffffffff10,iVar4,
                                 (void *)CONCAT17(in_stack_ffffffffffffff07,
                                                  CONCAT16(in_stack_ffffffffffffff06,
                                                           CONCAT24(in_stack_ffffffffffffff04,
                                                                    in_stack_ffffffffffffff00))),
                                 in_stack_fffffffffffffefc);
          if (iVar4 != 0) {
            local_1 = 1;
            iVar4 = 1;
            goto LAB_001d6bd5;
          }
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          if ((bVar1) ||
             (bVar1 = std::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8), bVar1))
          {
            std::__cxx11::string::c_str();
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_20,0);
            iVar4 = stbi_write_jpg((char *)CONCAT44(in_stack_ffffffffffffff6c,
                                                    in_stack_ffffffffffffff68),
                                   (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                   (int)in_stack_ffffffffffffff60,comp,
                                   (void *)CONCAT44(iVar4,in_stack_ffffffffffffff50),
                                   in_stack_ffffffffffffff4c);
            if (iVar4 != 0) {
              local_1 = 1;
              iVar4 = 1;
              goto LAB_001d6bd5;
            }
          }
        }
      }
LAB_001d6bca:
      iVar4 = 0;
    }
LAB_001d6bd5:
    std::__cxx11::string::~string(local_50);
    if (iVar4 != 0) goto LAB_001d6c3d;
  }
  poVar2 = err();
  poVar2 = std::operator<<(poVar2,"Failed to save image \"");
  poVar2 = std::operator<<(poVar2,local_18);
  poVar2 = std::operator<<(poVar2,"\"");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_1 = 0;
LAB_001d6c3d:
  return (bool)(local_1 & 1);
}

Assistant:

bool ImageLoader::saveImageToFile(const std::string& filename, const std::vector<Uint8>& pixels, const Vector2u& size)
{
    // Make sure the image is not empty
    if (!pixels.empty() && (size.x > 0) && (size.y > 0))
    {
        // Deduce the image type from its extension

        // Extract the extension
        const std::size_t dot = filename.find_last_of('.');
        const std::string extension = dot != std::string::npos ? toLower(filename.substr(dot + 1)) : "";
        const Vector2i convertedSize = Vector2i(size);

        if (extension == "bmp")
        {
            // BMP format
            if (stbi_write_bmp(filename.c_str(), convertedSize.x, convertedSize.y, 4, &pixels[0]))
                return true;
        }
        else if (extension == "tga")
        {
            // TGA format
            if (stbi_write_tga(filename.c_str(), convertedSize.x, convertedSize.y, 4, &pixels[0]))
                return true;
        }
        else if (extension == "png")
        {
            // PNG format
            if (stbi_write_png(filename.c_str(), convertedSize.x, convertedSize.y, 4, &pixels[0], 0))
                return true;
        }
        else if (extension == "jpg" || extension == "jpeg")
        {
            // JPG format
            if (stbi_write_jpg(filename.c_str(), convertedSize.x, convertedSize.y, 4, &pixels[0], 90))
                return true;
        }
    }

    err() << "Failed to save image \"" << filename << "\"" << std::endl;
    return false;
}